

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::faze(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
       *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  reference piVar4;
  reference piVar5;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *piVar6;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *this_00;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *this_01;
  iterator_range<const_int_*> __tmp;
  
  this_01 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
            (this->m_begin)._M_current;
  this_00 = this_01;
  while( true ) {
    piVar6 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             (this->m_end)._M_current;
    if (this_01 == piVar6) {
      piVar1 = this_00->m_Begin;
      piVar2 = this_00->m_End;
      piVar3 = piVar6[-1].m_End;
      this_00->m_Begin =
           (((iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag> *)
            &piVar6[-1].m_Begin)->
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_Begin;
      this_00->m_End = piVar3;
      (((iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag> *)
       &piVar6[-1].m_Begin)->
      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>).
      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = piVar1;
      piVar6[-1].m_End = piVar2;
      return;
    }
    piVar1 = this_01->m_Begin;
    this_01->m_Begin = piVar1 + 1;
    if (piVar1 + 1 == this_01->m_End) break;
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       (this_00);
    piVar5 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       (this_01);
    piVar6 = this_01;
    if (*piVar5 <= *piVar4) {
      piVar6 = this_00;
    }
    this_01 = this_01 + 1;
    this_00 = piVar6;
  }
  (this->m_end)._M_current = (this->m_begin)._M_current;
  return;
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }